

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O3

void __thiscall Jinx::Impl::Lexer::ParseString(Lexer *this)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  size_t sVar4;
  char *pcVar5;
  string_view text;
  
  sVar4 = GetUtf8CharSize(this->m_current);
  pcVar5 = this->m_current;
  pcVar1 = pcVar5 + sVar4;
  this->m_current = pcVar1;
  this->m_columnNumber = this->m_columnNumber + 1;
  cVar3 = pcVar5[sVar4];
  if ((cVar3 != '\0') && (pcVar5 = pcVar1, pcVar1 <= this->m_end)) {
    while ((cVar3 != '\n' && (cVar3 != '\r'))) {
      if (cVar3 == '\"') {
        text._M_len = (long)pcVar5 - (long)pcVar1;
        text._M_str = pcVar1;
        CreateSymbolString(this,text);
        return;
      }
      sVar4 = GetUtf8CharSize(pcVar5);
      pcVar2 = this->m_current;
      pcVar5 = pcVar2 + sVar4;
      this->m_current = pcVar5;
      this->m_columnNumber = this->m_columnNumber + 1;
      cVar3 = pcVar2[sVar4];
      if ((cVar3 == '\0') || (this->m_end < pcVar5)) break;
    }
  }
  Error<>(this,"Could not find matching quote");
  return;
}

Assistant:

inline_t void Lexer::ParseString()
	{
		// Advance past double quote character
		AdvanceCurrent();

		// Mark the start of the string
		const char * startName = m_current;

		// Check for matching end string token
		bool validString = false;
		while (!IsEndOfText())
		{
			if (IsNewline(*m_current))
				break;
			if (*m_current == '"')
			{
				validString = true;
				break;
			}
			AdvanceCurrent();
		}
		if (!validString)
		{
			Error("Could not find matching quote");
			return;
		}
		size_t count = m_current - startName;
		CreateSymbolString(std::string_view(startName, count));
	}